

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ParseContext::
ParseContext<google::protobuf::io::ZeroCopyInputStream*&,int&>
          (ParseContext *this,int depth,bool aliasing,char **start,ZeroCopyInputStream **args,
          int *args_1)

{
  _func_int **pp_Var1;
  ZeroCopyInputStream *in_RCX;
  undefined1 in_DL;
  undefined4 in_ESI;
  EpsCopyInputStream *in_RDI;
  undefined8 in_R8;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar2;
  
  uVar2 = CONCAT13(in_DL,in_stack_fffffffffffffff0) & 0x1ffffff;
  EpsCopyInputStream::EpsCopyInputStream(in_RDI,SUB41(uVar2 >> 0x18,0));
  *(undefined4 *)&in_RDI[1].limit_end_ = in_ESI;
  *(undefined4 *)((long)&in_RDI[1].limit_end_ + 4) = 0x80000000;
  Data::Data((Data *)&in_RDI[1].buffer_end_);
  pp_Var1 = (_func_int **)
            EpsCopyInputStream::InitFrom
                      ((EpsCopyInputStream *)CONCAT44(in_ESI,uVar2),in_RCX,
                       (int)((ulong)in_R8 >> 0x20));
  in_RCX->_vptr_ZeroCopyInputStream = pp_Var1;
  return;
}

Assistant:

ParseContext(int depth, bool aliasing, const char** start, T&&... args)
      : EpsCopyInputStream(aliasing), depth_(depth) {
    *start = InitFrom(std::forward<T>(args)...);
  }